

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O1

void __thiscall ExchangePaths_ImportEmpty_Test::TestBody(ExchangePaths_ImportEmpty_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  ostream *poVar2;
  pointer *__ptr_2;
  pointer *__ptr;
  char *message;
  char *in_R9;
  mock_mutex mutex;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> exported_paths;
  parser<pstore::exchange::import_ns::callbacks> name_parser;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  string_mapping imported_paths;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_218;
  undefined1 local_209;
  undefined1 auStack_208 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_200;
  long local_1f8 [2];
  string local_1e8;
  AssertHelper local_1c8;
  internal local_1c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  index_type local_1a8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  bool local_180;
  int local_138;
  error_category *local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  transaction<std::unique_lock<mock_mutex>_> local_e8;
  not_null<transaction_base_*> local_b0;
  string_mapping local_a8;
  
  local_1a0._0_4_ = 0xa5d5b;
  local_1a8 = 3;
  local_190._0_8_ = &local_209;
  local_190[8] = '\0';
  local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_190);
  local_190[8] = '\x01';
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_e8,&(this->super_ExchangePaths).import_db_,(lock_type *)local_190);
  if ((local_190[8] == '\x01') && ((long *)local_190._0_8_ != (long *)0x0)) {
    local_190[8] = '\0';
  }
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.strings_;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8.views_;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  local_a8.lookup_._M_h._M_buckets = &local_a8.lookup_._M_h._M_single_bucket;
  local_a8.lookup_._M_h._M_bucket_count = 1;
  local_a8.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a8.lookup_._M_h._M_element_count = 0;
  local_a8.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_a8.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  local_a8.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_a8.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_a8.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_a8.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  anon_unknown.dwarf_39da45::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)local_190,&local_e8,&local_a8);
  pbVar1 = local_1b0;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)auStack_208,local_1a8);
  local_200 = pbVar1;
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<pstore::exchange::import_ns::callbacks> *)local_190,
                       (span<const_char,__1L> *)auStack_208);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  local_1c0[0] = (internal)(local_138 == 0);
  local_1b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_1c0[0]) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_p != &local_100) {
      operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
    }
    if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)(local_190 + 8));
    if ((long *)local_190._0_8_ != (long *)0x0) {
      operator_delete((void *)local_190._0_8_,0x68);
    }
    local_b0.ptr_ = &local_e8.super_transaction_base;
    pstore::gsl::not_null<pstore::transaction_base_*>::ensure_invariant(&local_b0);
    pstore::exchange::import_ns::string_mapping::flush(&local_a8,local_b0);
    pstore::transaction_base::commit(&local_e8.super_transaction_base);
    pstore::exchange::import_ns::string_mapping::lookup
              ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_190,&local_a8,0);
    local_1e8._M_dataplus._M_p._0_4_ = 4;
    testing::internal::
    CmpHelperEQ<pstore::error_or<pstore::typed_address<pstore::indirect_string>>,pstore::exchange::import_ns::error>
              ((internal *)auStack_208,"imported_paths.lookup (0U)",
               "pstore::exchange::import_ns::error::no_such_name",
               (error_or<pstore::typed_address<pstore::indirect_string>_> *)local_190,
               (error *)&local_1e8);
    if (local_180 == false) {
      pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
      value_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>&,pstore::typed_address<pstore::indirect_string>>
                ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_190);
    }
    else {
      pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
      error_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>&,std::error_code>
                ((error_or<pstore::typed_address<pstore::indirect_string>_> *)local_190);
    }
    if (auStack_208[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_190);
      if (local_200 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = (local_200->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                 ,0x72,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e8,(Message *)local_190);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e8);
      if ((long *)local_190._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_190._0_8_ + 8))();
      }
    }
    if (local_200 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_200,local_200);
    }
  }
  else {
    testing::Message::Message((Message *)&local_218);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_218._M_head_impl + 0x10),"JSON error was: ",0x10);
    (**(code **)(*(long *)local_130 + 0x20))(auStack_208,local_130,local_138);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_218._M_head_impl + 0x10),(char *)auStack_208,(long)local_200);
    local_1e8._M_dataplus._M_p._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_218._M_head_impl + 0x10),(char *)&local_1e8,1);
    local_1e8._M_dataplus._M_p._0_1_ = 0x28;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)(local_218._M_head_impl + 0x10),(char *)&local_1e8,1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_1e8._M_dataplus._M_p._0_1_ = 0x3a;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1e8,1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    local_1e8._M_dataplus._M_p._0_1_ = 0x29;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1e8,1);
    local_1e8._M_dataplus._M_p._0_4_ = CONCAT31(local_1e8._M_dataplus._M_p._1_3_,10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_218._M_head_impl + 0x10),(char *)&local_1e8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_218._M_head_impl + 0x10),(char *)local_1b0,local_1a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e8,local_1c0,(AssertionResult *)"name_parser.has_error ()","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0x69,(char *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,
                                      local_1e8._M_dataplus._M_p._0_4_));
    testing::internal::AssertHelper::operator=(&local_1c8,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,local_1e8._M_dataplus._M_p._0_4_) !=
        &local_1e8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1e8._M_dataplus._M_p._4_4_,local_1e8._M_dataplus._M_p._0_4_),
                      local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (auStack_208 != (undefined1  [8])local_1f8) {
      operator_delete((void *)auStack_208,local_1f8[0] + 1);
    }
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
    if (local_1b8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b8,local_1b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_p != &local_100) {
      operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
    }
    if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
    }
    std::
    deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
    ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>_>_>
              *)(local_190 + 8));
    if ((long *)local_190._0_8_ != (long *)0x0) {
      operator_delete((void *)local_190._0_8_,0x68);
    }
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping(&local_a8);
  local_e8.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_0023bdb8;
  pstore::transaction_base::rollback(&local_e8.super_transaction_base);
  if ((local_e8.lock_._M_owns == true) && (local_e8.lock_._M_device != (mutex_type *)0x0)) {
    local_e8.lock_._M_owns = false;
  }
  if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0) {
    operator_delete(local_1b0,CONCAT44(local_1a0._4_4_,local_1a0._0_4_) + 1);
  }
  return;
}

Assistant:

TEST_F (ExchangePaths, ImportEmpty) {
    auto const exported_paths = "[]\n"s;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});

    pstore::exchange::import_ns::string_mapping imported_paths;
    {
        auto name_parser = import_strings_parser (&transaction, &imported_paths);
        name_parser.input (exported_paths).eof ();
        ASSERT_FALSE (name_parser.has_error ())
            << "JSON error was: " << name_parser.last_error ().message () << ' '
            << name_parser.coordinate () << '\n'
            << exported_paths;
    }

    imported_paths.flush (&transaction);
    transaction.commit ();

    EXPECT_EQ (imported_paths.lookup (0U), pstore::exchange::import_ns::error::no_such_name);
}